

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void iadst8x8_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  __m128i alVar7;
  int iVar8;
  int iVar10;
  int iVar11;
  undefined1 auVar9 [16];
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  undefined1 auVar15 [16];
  __m128i alVar16;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar25;
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  undefined1 auVar33 [16];
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar38 [16];
  int iVar39;
  __m128i offset;
  int iVar40;
  uint uVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  int iVar46;
  uint uVar47;
  
  auVar33 = ZEXT416((uint)bit);
  lVar5 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x170);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x250);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x1a0);
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar1;
  auVar9._8_4_ = uVar1;
  auVar9._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x220);
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x1e0);
  iVar4 = 1 << ((char)bit - 1U & 0x1f);
  auVar15 = pmulld(auVar24,(undefined1  [16])*in);
  alVar16[0]._0_4_ = auVar15._0_4_ + iVar4 >> auVar33;
  alVar16[0]._4_4_ = auVar15._4_4_ + iVar4 >> auVar33;
  alVar16[1]._0_4_ = auVar15._8_4_ + iVar4 >> auVar33;
  alVar16[1]._4_4_ = auVar15._12_4_ + iVar4 >> auVar33;
  auVar24 = pmulld(auVar27,(undefined1  [16])*in);
  auVar15._0_4_ = iVar4 - auVar24._0_4_ >> auVar33;
  auVar15._4_4_ = iVar4 - auVar24._4_4_ >> auVar33;
  auVar15._8_4_ = iVar4 - auVar24._8_4_ >> auVar33;
  auVar15._12_4_ = iVar4 - auVar24._12_4_ >> auVar33;
  auVar27 = pmulld((undefined1  [16])alVar16,auVar9);
  auVar24 = pmulld(auVar15,auVar6);
  auVar28._0_4_ = auVar27._0_4_ + iVar4 + auVar24._0_4_ >> auVar33;
  auVar28._4_4_ = auVar27._4_4_ + iVar4 + auVar24._4_4_ >> auVar33;
  auVar28._8_4_ = auVar27._8_4_ + iVar4 + auVar24._8_4_ >> auVar33;
  auVar28._12_4_ = auVar27._12_4_ + iVar4 + auVar24._12_4_ >> auVar33;
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar6 = pmulld(auVar6,(undefined1  [16])alVar16);
  auVar9 = pmulld(auVar9,auVar15);
  alVar7[0]._0_4_ = (auVar6._0_4_ + iVar4) - auVar9._0_4_ >> auVar33;
  alVar7[0]._4_4_ = (auVar6._4_4_ + iVar4) - auVar9._4_4_ >> auVar33;
  alVar7[1]._0_4_ = (auVar6._8_4_ + iVar4) - auVar9._8_4_ >> auVar33;
  alVar7[1]._4_4_ = (auVar6._12_4_ + iVar4) - auVar9._12_4_ >> auVar33;
  auVar6 = pmulld((undefined1  [16])alVar16,auVar38);
  auVar9 = pmulld(auVar15,auVar38);
  iVar8 = auVar6._0_4_ + iVar4;
  iVar10 = auVar6._4_4_ + iVar4;
  iVar11 = auVar6._8_4_ + iVar4;
  iVar12 = auVar6._12_4_ + iVar4;
  iVar29 = iVar8 + auVar9._0_4_ >> auVar33;
  iVar30 = iVar10 + auVar9._4_4_ >> auVar33;
  iVar31 = iVar11 + auVar9._8_4_ >> auVar33;
  iVar32 = iVar12 + auVar9._12_4_ >> auVar33;
  iVar8 = iVar8 - auVar9._0_4_ >> auVar33;
  iVar10 = iVar10 - auVar9._4_4_ >> auVar33;
  iVar11 = iVar11 - auVar9._8_4_ >> auVar33;
  iVar12 = iVar12 - auVar9._12_4_ >> auVar33;
  auVar6 = pmulld(auVar28,auVar38);
  auVar9 = pmulld(auVar38,(undefined1  [16])alVar7);
  iVar23 = auVar6._0_4_ + iVar4;
  iVar25 = auVar6._4_4_ + iVar4;
  iVar26 = auVar6._8_4_ + iVar4;
  iVar4 = auVar6._12_4_ + iVar4;
  iVar34 = iVar23 + auVar9._0_4_ >> auVar33;
  iVar35 = iVar25 + auVar9._4_4_ >> auVar33;
  iVar36 = iVar26 + auVar9._8_4_ >> auVar33;
  iVar37 = iVar4 + auVar9._12_4_ >> auVar33;
  iVar23 = iVar23 - auVar9._0_4_ >> auVar33;
  iVar25 = iVar25 - auVar9._4_4_ >> auVar33;
  iVar26 = iVar26 - auVar9._8_4_ >> auVar33;
  iVar4 = iVar4 - auVar9._12_4_ >> auVar33;
  if (do_cols != 0) {
    *out = alVar16;
    *(int *)out[1] = -auVar28._0_4_;
    *(int *)((long)out[1] + 4) = -auVar28._4_4_;
    *(int *)(out[1] + 1) = -auVar28._8_4_;
    *(int *)((long)out[1] + 0xc) = -auVar28._12_4_;
    *(int *)out[2] = iVar34;
    *(int *)((long)out[2] + 4) = iVar35;
    *(int *)(out[2] + 1) = iVar36;
    *(int *)((long)out[2] + 0xc) = iVar37;
    *(int *)out[3] = -iVar29;
    *(int *)((long)out[3] + 4) = -iVar30;
    *(int *)(out[3] + 1) = -iVar31;
    *(int *)((long)out[3] + 0xc) = -iVar32;
    *(int *)out[4] = iVar8;
    *(int *)((long)out[4] + 4) = iVar10;
    *(int *)(out[4] + 1) = iVar11;
    *(int *)((long)out[4] + 0xc) = iVar12;
    *(int *)out[5] = -iVar23;
    *(int *)((long)out[5] + 4) = -iVar25;
    *(int *)(out[5] + 1) = -iVar26;
    *(int *)((long)out[5] + 0xc) = -iVar4;
    out[6] = alVar7;
    *(int *)out[7] = -auVar15._0_4_;
    *(int *)((long)out[7] + 4) = -auVar15._4_4_;
    *(int *)(out[7] + 1) = -auVar15._8_4_;
    *(int *)((long)out[7] + 0xc) = -auVar15._12_4_;
    return;
  }
  iVar2 = 10;
  if (10 < bd) {
    iVar2 = bd;
  }
  iVar2 = 0x20 << ((byte)iVar2 & 0x1f);
  iVar3 = -iVar2;
  iVar2 = iVar2 + -1;
  iVar39 = (1 << ((byte)out_shift & 0x1f)) >> 1;
  auVar6 = ZEXT416((uint)out_shift);
  iVar13 = (int)alVar16[0] + iVar39 >> auVar6;
  iVar17 = alVar16[0]._4_4_ + iVar39 >> auVar6;
  iVar19 = (int)alVar16[1] + iVar39 >> auVar6;
  iVar21 = alVar16[1]._4_4_ + iVar39 >> auVar6;
  iVar40 = iVar39 - auVar28._0_4_ >> auVar6;
  iVar42 = iVar39 - auVar28._4_4_ >> auVar6;
  iVar44 = iVar39 - auVar28._8_4_ >> auVar6;
  iVar46 = iVar39 - auVar28._12_4_ >> auVar6;
  uVar14 = (uint)(iVar13 < iVar3) * iVar3 | (uint)(iVar13 >= iVar3) * iVar13;
  uVar18 = (uint)(iVar17 < iVar3) * iVar3 | (uint)(iVar17 >= iVar3) * iVar17;
  uVar20 = (uint)(iVar19 < iVar3) * iVar3 | (uint)(iVar19 >= iVar3) * iVar19;
  uVar22 = (uint)(iVar21 < iVar3) * iVar3 | (uint)(iVar21 >= iVar3) * iVar21;
  uVar41 = (uint)(iVar40 < iVar3) * iVar3 | (uint)(iVar40 >= iVar3) * iVar40;
  uVar43 = (uint)(iVar42 < iVar3) * iVar3 | (uint)(iVar42 >= iVar3) * iVar42;
  uVar45 = (uint)(iVar44 < iVar3) * iVar3 | (uint)(iVar44 >= iVar3) * iVar44;
  uVar47 = (uint)(iVar46 < iVar3) * iVar3 | (uint)(iVar46 >= iVar3) * iVar46;
  *(uint *)*out = (uint)(iVar2 < (int)uVar14) * iVar2 | (iVar2 >= (int)uVar14) * uVar14;
  *(uint *)((long)*out + 4) = (uint)(iVar2 < (int)uVar18) * iVar2 | (iVar2 >= (int)uVar18) * uVar18;
  *(uint *)(*out + 1) = (uint)(iVar2 < (int)uVar20) * iVar2 | (iVar2 >= (int)uVar20) * uVar20;
  *(uint *)((long)*out + 0xc) =
       (uint)(iVar2 < (int)uVar22) * iVar2 | (iVar2 >= (int)uVar22) * uVar22;
  iVar34 = iVar34 + iVar39 >> auVar6;
  iVar35 = iVar35 + iVar39 >> auVar6;
  iVar36 = iVar36 + iVar39 >> auVar6;
  iVar37 = iVar37 + iVar39 >> auVar6;
  iVar29 = iVar39 - iVar29 >> auVar6;
  iVar30 = iVar39 - iVar30 >> auVar6;
  iVar31 = iVar39 - iVar31 >> auVar6;
  iVar32 = iVar39 - iVar32 >> auVar6;
  *(uint *)out[1] = (uint)(iVar2 < (int)uVar41) * iVar2 | (iVar2 >= (int)uVar41) * uVar41;
  *(uint *)((long)out[1] + 4) =
       (uint)(iVar2 < (int)uVar43) * iVar2 | (iVar2 >= (int)uVar43) * uVar43;
  *(uint *)(out[1] + 1) = (uint)(iVar2 < (int)uVar45) * iVar2 | (iVar2 >= (int)uVar45) * uVar45;
  *(uint *)((long)out[1] + 0xc) =
       (uint)(iVar2 < (int)uVar47) * iVar2 | (iVar2 >= (int)uVar47) * uVar47;
  uVar41 = (uint)(iVar34 < iVar3) * iVar3 | (uint)(iVar34 >= iVar3) * iVar34;
  uVar43 = (uint)(iVar35 < iVar3) * iVar3 | (uint)(iVar35 >= iVar3) * iVar35;
  uVar45 = (uint)(iVar36 < iVar3) * iVar3 | (uint)(iVar36 >= iVar3) * iVar36;
  uVar47 = (uint)(iVar37 < iVar3) * iVar3 | (uint)(iVar37 >= iVar3) * iVar37;
  uVar14 = (uint)(iVar29 < iVar3) * iVar3 | (uint)(iVar29 >= iVar3) * iVar29;
  uVar18 = (uint)(iVar30 < iVar3) * iVar3 | (uint)(iVar30 >= iVar3) * iVar30;
  uVar20 = (uint)(iVar31 < iVar3) * iVar3 | (uint)(iVar31 >= iVar3) * iVar31;
  uVar22 = (uint)(iVar32 < iVar3) * iVar3 | (uint)(iVar32 >= iVar3) * iVar32;
  *(uint *)out[2] = (uint)(iVar2 < (int)uVar41) * iVar2 | (iVar2 >= (int)uVar41) * uVar41;
  *(uint *)((long)out[2] + 4) =
       (uint)(iVar2 < (int)uVar43) * iVar2 | (iVar2 >= (int)uVar43) * uVar43;
  *(uint *)(out[2] + 1) = (uint)(iVar2 < (int)uVar45) * iVar2 | (iVar2 >= (int)uVar45) * uVar45;
  *(uint *)((long)out[2] + 0xc) =
       (uint)(iVar2 < (int)uVar47) * iVar2 | (iVar2 >= (int)uVar47) * uVar47;
  *(uint *)out[3] = (uint)(iVar2 < (int)uVar14) * iVar2 | (iVar2 >= (int)uVar14) * uVar14;
  *(uint *)((long)out[3] + 4) =
       (uint)(iVar2 < (int)uVar18) * iVar2 | (iVar2 >= (int)uVar18) * uVar18;
  *(uint *)(out[3] + 1) = (uint)(iVar2 < (int)uVar20) * iVar2 | (iVar2 >= (int)uVar20) * uVar20;
  *(uint *)((long)out[3] + 0xc) =
       (uint)(iVar2 < (int)uVar22) * iVar2 | (iVar2 >= (int)uVar22) * uVar22;
  iVar8 = iVar8 + iVar39 >> auVar6;
  iVar10 = iVar10 + iVar39 >> auVar6;
  iVar11 = iVar11 + iVar39 >> auVar6;
  iVar12 = iVar12 + iVar39 >> auVar6;
  iVar23 = iVar39 - iVar23 >> auVar6;
  iVar25 = iVar39 - iVar25 >> auVar6;
  iVar26 = iVar39 - iVar26 >> auVar6;
  iVar4 = iVar39 - iVar4 >> auVar6;
  uVar14 = (uint)(iVar8 < iVar3) * iVar3 | (uint)(iVar8 >= iVar3) * iVar8;
  uVar18 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar20 = (uint)(iVar11 < iVar3) * iVar3 | (uint)(iVar11 >= iVar3) * iVar11;
  uVar22 = (uint)(iVar12 < iVar3) * iVar3 | (uint)(iVar12 >= iVar3) * iVar12;
  uVar41 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar43 = (uint)(iVar25 < iVar3) * iVar3 | (uint)(iVar25 >= iVar3) * iVar25;
  uVar45 = (uint)(iVar26 < iVar3) * iVar3 | (uint)(iVar26 >= iVar3) * iVar26;
  uVar47 = (uint)(iVar4 < iVar3) * iVar3 | (uint)(iVar4 >= iVar3) * iVar4;
  *(uint *)out[4] = (uint)(iVar2 < (int)uVar14) * iVar2 | (iVar2 >= (int)uVar14) * uVar14;
  *(uint *)((long)out[4] + 4) =
       (uint)(iVar2 < (int)uVar18) * iVar2 | (iVar2 >= (int)uVar18) * uVar18;
  *(uint *)(out[4] + 1) = (uint)(iVar2 < (int)uVar20) * iVar2 | (iVar2 >= (int)uVar20) * uVar20;
  *(uint *)((long)out[4] + 0xc) =
       (uint)(iVar2 < (int)uVar22) * iVar2 | (iVar2 >= (int)uVar22) * uVar22;
  *(uint *)out[5] = (uint)(iVar2 < (int)uVar41) * iVar2 | (iVar2 >= (int)uVar41) * uVar41;
  *(uint *)((long)out[5] + 4) =
       (uint)(iVar2 < (int)uVar43) * iVar2 | (iVar2 >= (int)uVar43) * uVar43;
  *(uint *)(out[5] + 1) = (uint)(iVar2 < (int)uVar45) * iVar2 | (iVar2 >= (int)uVar45) * uVar45;
  *(uint *)((long)out[5] + 0xc) =
       (uint)(iVar2 < (int)uVar47) * iVar2 | (iVar2 >= (int)uVar47) * uVar47;
  iVar4 = (int)alVar7[0] + iVar39 >> auVar6;
  iVar8 = alVar7[0]._4_4_ + iVar39 >> auVar6;
  iVar10 = (int)alVar7[1] + iVar39 >> auVar6;
  iVar11 = alVar7[1]._4_4_ + iVar39 >> auVar6;
  iVar12 = iVar39 - auVar15._0_4_ >> auVar6;
  iVar23 = iVar39 - auVar15._4_4_ >> auVar6;
  iVar25 = iVar39 - auVar15._8_4_ >> auVar6;
  iVar26 = iVar39 - auVar15._12_4_ >> auVar6;
  uVar14 = (uint)(iVar4 < iVar3) * iVar3 | (uint)(iVar4 >= iVar3) * iVar4;
  uVar18 = (uint)(iVar8 < iVar3) * iVar3 | (uint)(iVar8 >= iVar3) * iVar8;
  uVar20 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar22 = (uint)(iVar11 < iVar3) * iVar3 | (uint)(iVar11 >= iVar3) * iVar11;
  uVar41 = (uint)(iVar12 < iVar3) * iVar3 | (uint)(iVar12 >= iVar3) * iVar12;
  uVar43 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar45 = (uint)(iVar25 < iVar3) * iVar3 | (uint)(iVar25 >= iVar3) * iVar25;
  uVar47 = (uint)(iVar26 < iVar3) * iVar3 | (uint)(iVar26 >= iVar3) * iVar26;
  *(uint *)out[6] = (uint)(iVar2 < (int)uVar14) * iVar2 | (iVar2 >= (int)uVar14) * uVar14;
  *(uint *)((long)out[6] + 4) =
       (uint)(iVar2 < (int)uVar18) * iVar2 | (iVar2 >= (int)uVar18) * uVar18;
  *(uint *)(out[6] + 1) = (uint)(iVar2 < (int)uVar20) * iVar2 | (iVar2 >= (int)uVar20) * uVar20;
  *(uint *)((long)out[6] + 0xc) =
       (uint)(iVar2 < (int)uVar22) * iVar2 | (iVar2 >= (int)uVar22) * uVar22;
  *(uint *)out[7] = (uint)(iVar2 < (int)uVar41) * iVar2 | (iVar2 >= (int)uVar41) * uVar41;
  *(uint *)((long)out[7] + 4) =
       (uint)(iVar2 < (int)uVar43) * iVar2 | (iVar2 >= (int)uVar43) * uVar43;
  *(uint *)(out[7] + 1) = (uint)(iVar2 < (int)uVar45) * iVar2 | (iVar2 >= (int)uVar45) * uVar45;
  *(uint *)((long)out[7] + 0xc) =
       (uint)(iVar2 < (int)uVar47) * iVar2 | (iVar2 >= (int)uVar47) * uVar47;
  return;
}

Assistant:

static void iadst8x8_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                 int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i kZero = _mm_setzero_si128();
  __m128i u[8], x;

  // stage 0
  // stage 1
  // stage 2

  x = _mm_mullo_epi32(in[0], cospi60);
  u[0] = _mm_add_epi32(x, rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  x = _mm_mullo_epi32(in[0], cospi4);
  u[1] = _mm_sub_epi32(kZero, x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // stage 3
  // stage 4
  __m128i temp1, temp2;
  temp1 = _mm_mullo_epi32(u[0], cospi16);
  x = _mm_mullo_epi32(u[1], cospi48);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);
  u[4] = temp1;

  temp2 = _mm_mullo_epi32(u[0], cospi48);
  x = _mm_mullo_epi32(u[1], cospi16);
  u[5] = _mm_sub_epi32(temp2, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // stage 5
  // stage 6
  temp1 = _mm_mullo_epi32(u[0], cospi32);
  x = _mm_mullo_epi32(u[1], cospi32);
  u[2] = _mm_add_epi32(temp1, x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(temp1, x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  temp1 = _mm_mullo_epi32(u[4], cospi32);
  x = _mm_mullo_epi32(u[5], cospi32);
  u[6] = _mm_add_epi32(temp1, x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(temp1, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
  }
}